

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageTestsUtil.cpp
# Opt level: O3

UVec3 __thiscall vkt::image::getShaderGridSize(image *this,ImageType imageType,UVec3 *imageSize)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  UVec3 UVar4;
  
  UVar4.m_data[2] = (uint)imageSize;
  uVar1 = 1;
  switch(imageType) {
  case IMAGE_TYPE_1D:
  case IMAGE_TYPE_BUFFER:
    uVar2 = imageSize->m_data[0];
    goto LAB_00712a62;
  case IMAGE_TYPE_1D_ARRAY:
    uVar2 = imageSize->m_data[0];
    uVar3 = imageSize->m_data[2];
    break;
  case IMAGE_TYPE_2D:
    uVar2 = imageSize->m_data[0];
    uVar3 = imageSize->m_data[1];
    break;
  case IMAGE_TYPE_2D_ARRAY:
  case IMAGE_TYPE_3D:
    uVar2 = imageSize->m_data[0];
    uVar3 = imageSize->m_data[1];
    uVar1 = imageSize->m_data[2];
    break;
  case IMAGE_TYPE_CUBE:
    uVar2 = imageSize->m_data[0];
    uVar3 = imageSize->m_data[1];
    uVar1 = 6;
    break;
  case IMAGE_TYPE_CUBE_ARRAY:
    uVar2 = imageSize->m_data[0];
    uVar3 = imageSize->m_data[1];
    uVar1 = imageSize->m_data[2] * 6;
    break;
  default:
    uVar2 = 1;
LAB_00712a62:
    uVar3 = 1;
  }
  *(uint *)this = uVar2;
  *(uint *)(this + 4) = uVar3;
  *(uint *)(this + 8) = uVar1;
  UVar4.m_data._0_8_ = this;
  return (UVec3)UVar4.m_data;
}

Assistant:

tcu::UVec3 getShaderGridSize (const ImageType imageType, const tcu::UVec3& imageSize)
{
	switch (imageType)
	{
		case IMAGE_TYPE_1D:
		case IMAGE_TYPE_BUFFER:
			return tcu::UVec3(imageSize.x(), 1u, 1u);

		case IMAGE_TYPE_1D_ARRAY:
			return tcu::UVec3(imageSize.x(), imageSize.z(), 1u);

		case IMAGE_TYPE_2D:
			return tcu::UVec3(imageSize.x(), imageSize.y(), 1u);

		case IMAGE_TYPE_2D_ARRAY:
		case IMAGE_TYPE_3D:
			return tcu::UVec3(imageSize.x(), imageSize.y(), imageSize.z());

		case IMAGE_TYPE_CUBE:
			return tcu::UVec3(imageSize.x(), imageSize.y(), 6u);

		case IMAGE_TYPE_CUBE_ARRAY:
			return tcu::UVec3(imageSize.x(), imageSize.y(), 6u * imageSize.z());

		default:
			DE_FATAL("Unknown image type");
			return tcu::UVec3(1u, 1u, 1u);
	}
}